

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexTriangleFilter::apply
          (PtexTriangleFilter *this,PtexTriangleKernel *k,int faceid,FaceInfo *f)

{
  undefined1 uVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  PtexPtr<Ptex::v2_2::PtexFaceData> dh;
  PtexTriangleKernelIter kodd;
  PtexTriangleKernelIter keven;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_a0;
  PtexTriangleKernelIter local_98;
  PtexTriangleKernelIter local_5c;
  
  uVar1 = (f->res).ulog2;
  cVar2 = uVar1;
  if ((char)*(undefined4 *)k < (char)uVar1) {
    cVar2 = (char)*(undefined4 *)k;
  }
  (k->res).ulog2 = cVar2;
  (k->res).vlog2 = cVar2;
  PtexTriangleKernel::clampExtent(k);
  PtexTriangleKernel::getIterators(k,&local_5c,&local_98);
  if ((local_5c.valid != false) || (local_98.valid == true)) {
    iVar3 = (*this->_tx->_vptr_PtexTexture[0x14])(this->_tx,(ulong)(uint)faceid,(ulong)*(uint *)k);
    local_a0._ptr = (PtexFaceData *)CONCAT44(extraout_var,iVar3);
    if (local_a0._ptr != (PtexFaceData *)0x0) {
      if (local_5c.valid == true) {
        applyIter(this,&local_5c,local_a0._ptr);
      }
      if (local_98.valid == true) {
        applyIter(this,&local_98,local_a0._ptr);
      }
    }
    PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&local_a0);
  }
  return;
}

Assistant:

void PtexTriangleFilter::apply(PtexTriangleKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    // clamp kernel face (resolution and extent)
    k.clampRes(f.res);
    k.clampExtent();

    // build kernel iterators
    PtexTriangleKernelIter keven, kodd;
    k.getIterators(keven, kodd);
    if (!keven.valid && !kodd.valid) return;

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (keven.valid) applyIter(keven, dh);
    if (kodd.valid) applyIter(kodd, dh);
}